

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_11::NameApplier::OnDelegateExpr(NameApplier *this,TryExpr *expr)

{
  Var *in_RCX;
  string_view sVar1;
  string_view name;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(&this->labels_);
  sVar1 = FindLabelByVar(this,&expr->delegate_target);
  name._M_str = (char *)&expr->delegate_target;
  name._M_len = (size_t)sVar1._M_str;
  UseNameForVar((NameApplier *)sVar1._M_len,name,in_RCX);
  return (Result)Ok;
}

Assistant:

Result NameApplier::OnDelegateExpr(TryExpr* expr) {
  PopLabel();
  std::string_view label = FindLabelByVar(&expr->delegate_target);
  UseNameForVar(label, &expr->delegate_target);
  return Result::Ok;
}